

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inference.cc
# Opt level: O2

int __thiscall
xLearn::Predictor::sign
          (Predictor *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t *siglen,uchar *tbs,size_t tbslen)

{
  long lVar1;
  long lVar2;
  long lVar3;
  undefined8 uVar4;
  ostream *poVar5;
  long lVar6;
  allocator local_56;
  allocator local_55;
  Logger local_54;
  string local_50;
  string local_30;
  
  lVar1 = *(long *)ctx;
  lVar2 = *(long *)(ctx + 8);
  lVar3 = *(long *)sig;
  if (lVar2 - lVar1 == *(long *)(sig + 8) - lVar3) {
    for (lVar6 = 0; lVar2 - lVar1 >> 2 != lVar6; lVar6 = lVar6 + 1) {
      uVar4 = vcmpss_avx512f(ZEXT816(0) << 0x40,ZEXT416(*(uint *)(lVar1 + lVar6 * 4)),1);
      *(uint *)(lVar3 + lVar6 * 4) = (uint)((byte)uVar4 & 1) * 0x3f800000;
    }
    return (int)lVar1;
  }
  local_54.severity_ = ERR;
  std::__cxx11::string::string
            ((string *)&local_30,
             "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/solver/inference.cc"
             ,&local_55);
  std::__cxx11::string::string((string *)&local_50,"sign",&local_56);
  poVar5 = Logger::Start(ERR,&local_30,0x50,&local_50);
  poVar5 = std::operator<<(poVar5,"CHECK_EQ failed ");
  poVar5 = std::operator<<(poVar5,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/solver/inference.cc"
                          );
  poVar5 = std::operator<<(poVar5,":");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x50);
  poVar5 = std::operator<<(poVar5,"\n");
  poVar5 = std::operator<<(poVar5,"in.size()");
  poVar5 = std::operator<<(poVar5," = ");
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  poVar5 = std::operator<<(poVar5,"\n");
  poVar5 = std::operator<<(poVar5,"out.size()");
  poVar5 = std::operator<<(poVar5," = ");
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  std::operator<<(poVar5,"\n");
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  Logger::~Logger(&local_54);
  abort();
}

Assistant:

void Predictor::sign(std::vector<real_t>& in, 
                     std::vector<real_t>& out) {
  CHECK_EQ(in.size(), out.size());
  for (size_t i = 0; i < in.size(); ++i) {
    out[i] = in[i] > 0 ? 1 : 0;
  }
}